

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O0

void * strbuf_append(strbuf *buf_o,size_t len)

{
  size_t sVar1;
  char *pcVar2;
  char *toret;
  strbuf_impl *buf;
  size_t len_local;
  strbuf *buf_o_local;
  
  pcVar2 = (char *)safegrowarray(buf_o->s,(size_t *)&buf_o[-1].binarysink_[0].binarysink_,1,
                                 buf_o->len + 1,len,(_Bool)(*(byte *)&buf_o[1].s & 1));
  buf_o->s = pcVar2;
  buf_o->u = (uchar *)buf_o->s;
  pcVar2 = buf_o->s;
  sVar1 = buf_o->len;
  buf_o->len = len + buf_o->len;
  buf_o->s[buf_o->len] = '\0';
  return pcVar2 + sVar1;
}

Assistant:

void *strbuf_append(strbuf *buf_o, size_t len)
{
    struct strbuf_impl *buf = container_of(buf_o, struct strbuf_impl, visible);
    char *toret;
    sgrowarray_general(
        buf->visible.s, buf->size, buf->visible.len + 1, len, buf->nm);
    STRBUF_SET_UPTR(buf);
    toret = buf->visible.s + buf->visible.len;
    buf->visible.len += len;
    buf->visible.s[buf->visible.len] = '\0';
    return toret;
}